

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

Expression * __thiscall
rsg::BinaryOp<4,_(rsg::Associativity)0>::createNextChild
          (BinaryOp<4,_(rsg::Associativity)0> *this,GeneratorState *state)

{
  pointer *ppiVar1;
  ConstValueRangeAccess valueRange;
  Scalar *pSVar2;
  Expression *pEVar3;
  Scalar *pSVar4;
  undefined1 (*pauVar5) [16];
  ValueRange *pVVar6;
  Expression **ppEVar7;
  undefined1 local_48 [24];
  undefined1 local_30 [24];
  
  if (this->m_rightValueExpr == (Expression *)0x0) {
    ppEVar7 = &this->m_rightValueExpr;
    GeneratorState::pushPrecedence(state,3);
    pVVar6 = &this->m_rightValueRange;
    pSVar4 = (this->m_rightValueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (this->m_rightValueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar4 == (this->m_rightValueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar4 = (Scalar *)0x0;
    }
    if (pSVar2 == (this->m_rightValueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar2 = (Scalar *)0x0;
    }
    pauVar5 = (undefined1 (*) [16])local_30;
  }
  else {
    if (this->m_leftValueExpr != (Expression *)0x0) {
      return (Expression *)0x0;
    }
    ppEVar7 = &this->m_leftValueExpr;
    GeneratorState::pushPrecedence(state,4);
    pVVar6 = &this->m_leftValueRange;
    pSVar4 = (this->m_leftValueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (this->m_leftValueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar4 == (this->m_leftValueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar4 = (Scalar *)0x0;
    }
    if (pSVar2 == (this->m_leftValueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar2 = (Scalar *)0x0;
    }
    pauVar5 = (undefined1 (*) [16])local_48;
  }
  *(ValueRange **)*pauVar5 = pVVar6;
  *(Scalar **)(*pauVar5 + 8) = pSVar4;
  *(Scalar **)pauVar5[1] = pSVar2;
  valueRange.m_max = pSVar2;
  valueRange._0_16_ = *pauVar5;
  pEVar3 = Expression::createRandom(state,valueRange);
  *ppEVar7 = pEVar3;
  ppiVar1 = &(state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar1 = *ppiVar1 + -1;
  return pEVar3;
}

Assistant:

Expression* BinaryOp<Precedence, Assoc>::createNextChild (GeneratorState& state)
{
	int leftPrec	= Assoc == ASSOCIATIVITY_LEFT ? Precedence : Precedence-1;
	int rightPrec	= Assoc == ASSOCIATIVITY_LEFT ? Precedence-1 : Precedence;

	if (m_rightValueExpr == DE_NULL)
	{
		state.pushPrecedence(rightPrec);
		m_rightValueExpr = Expression::createRandom(state, m_rightValueRange.asAccess());
		state.popPrecedence();
		return m_rightValueExpr;
	}
	else if (m_leftValueExpr == DE_NULL)
	{
		state.pushPrecedence(leftPrec);
		m_leftValueExpr = Expression::createRandom(state, m_leftValueRange.asAccess());
		state.popPrecedence();
		return m_leftValueExpr;
	}
	else
		return DE_NULL;
}